

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O3

float crnlib::blackman_filter(float t)

{
  double dVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  undefined8 local_28;
  
  fVar4 = -t;
  if (-t <= t) {
    fVar4 = t;
  }
  fVar3 = 0.0;
  if (fVar4 < 3.0) {
    dVar1 = (double)fVar4 * 3.141592653589793;
    if (0.009999999776482582 <= ABS(dVar1)) {
      local_28 = sin(dVar1);
      local_28 = local_28 / dVar1;
    }
    else {
      local_28 = ((dVar1 * dVar1) / 120.0 + -0.1666666716337204) * dVar1 * dVar1 + 1.0;
    }
    dVar1 = cos((double)(fVar4 / 3.0) * 3.141592653589793);
    dVar2 = cos((double)(fVar4 / 3.0) * 6.283185307179586);
    local_28 = (dVar2 * 0.07684867084026337 + dVar1 * 0.49656063318252563 + 0.4265907108783722) *
               local_28;
    fVar3 = 0.0;
    if (1.249999968422344e-05 <= ABS(local_28)) {
      fVar3 = (float)local_28;
    }
  }
  return fVar3;
}

Assistant:

static float blackman_filter(float t)
    {
        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < 3.0f)
        {
            //return clean(sinc(t) * blackman_window(t / 3.0f));
            return clean(sinc(t) * blackman_exact_window(t / 3.0f));
        }
        else
        {
            return 0.0f;
        }
    }